

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

string * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::Gen1ViolMax_abi_cxx11_(string *__return_storage_ptr__,void *this,bool f_max,double viol,char *nm)

{
  BasicCStringRef<char> arg0;
  MemoryWriter wrt;
  char *local_250;
  double local_248;
  BasicMemoryWriter<char,_std::allocator<char>_> local_240;
  
  local_240.super_BasicWriter<char>.buffer_ = &local_240.buffer_.super_Buffer<char>;
  local_240.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_004bb5f8;
  local_240.buffer_.super_Buffer<char>.ptr_ = local_240.buffer_.data_;
  local_240.buffer_.super_Buffer<char>.size_ = 0;
  local_240.buffer_.super_Buffer<char>.capacity_ = 500;
  local_240.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004bb640;
  local_250 = nm;
  local_248 = viol;
  if (0.0 < viol) {
    if (f_max) {
      fmt::BasicWriter<char>::write<double>
                (&local_240.super_BasicWriter<char>,(BasicCStringRef<char>)0x367a4b,&local_248);
    }
    if ((nm != (char *)0x0) && (*nm != '\0')) {
      arg0.data_ = "[";
      if (f_max) {
        arg0.data_ = " [";
      }
      fmt::BasicWriter<char>::write<>(&local_240.super_BasicWriter<char>,arg0);
      fmt::BasicWriter<char>::write<char_const*>
                (&local_240.super_BasicWriter<char>,(BasicCStringRef<char>)0x385066,&local_250);
    }
  }
  if ((local_240.super_BasicWriter<char>.buffer_)->size_ == 0) {
    fmt::BasicWriter<char>::write<>
              (&local_240.super_BasicWriter<char>,(BasicCStringRef<char>)0x386711);
  }
  fmt::BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,&local_240.super_BasicWriter<char>);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_240);
  return __return_storage_ptr__;
}

Assistant:

std::string Gen1ViolMax(
      bool f_max, double viol, const char* nm) {
    fmt::MemoryWriter wrt;
    if (viol>0.0) {
      if (f_max)
        wrt.write("{:.0E}", viol);
      if (nm && *nm != '\0') {
        wrt.write(f_max ? " [" : "[");
        wrt.write("{}]", nm);
      }
    }
    if (0 == wrt.size())
      wrt.write("-");
    return wrt.str();
  }